

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void minmaxFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint uVar1;
  void *pvVar2;
  sqlite3_value *psVar3;
  CollSeq *pColl;
  Mem *pMem2;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  pvVar2 = context->pFunc->pUserData;
  psVar3 = *argv;
  uVar4._0_2_ = psVar3->flags;
  uVar4._2_1_ = psVar3->enc;
  uVar4._3_1_ = psVar3->eSubtype;
  if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar4 & 0x3f) & 1) != 0) {
    return;
  }
  uVar6 = 0;
  if (1 < argc) {
    pColl = context->pVdbe->aOp[(long)context->iOp + -1].p4.pColl;
    uVar5 = 1;
    do {
      pMem2 = argv[uVar5];
      uVar1._0_2_ = pMem2->flags;
      uVar1._2_1_ = pMem2->enc;
      uVar1._3_1_ = pMem2->eSubtype;
      if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
        return;
      }
      uVar4 = sqlite3MemCompare(argv[(int)uVar6],pMem2,pColl);
      if (-1 < (int)(uVar4 ^ -(uint)(pvVar2 != (void *)0x0))) {
        uVar6 = uVar5 & 0xffffffff;
      }
      uVar5 = uVar5 + 1;
    } while ((uint)argc != uVar5);
    uVar6 = (ulong)(int)uVar6;
  }
  sqlite3_result_value(context,argv[uVar6]);
  return;
}

Assistant:

static void minmaxFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int i;
  int mask;    /* 0 for min() or 0xffffffff for max() */
  int iBest;
  CollSeq *pColl;

  assert( argc>1 );
  mask = sqlite3_user_data(context)==0 ? 0 : -1;
  pColl = sqlite3GetFuncCollSeq(context);
  assert( pColl );
  assert( mask==-1 || mask==0 );
  iBest = 0;
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  for(i=1; i<argc; i++){
    if( sqlite3_value_type(argv[i])==SQLITE_NULL ) return;
    if( (sqlite3MemCompare(argv[iBest], argv[i], pColl)^mask)>=0 ){
      testcase( mask==0 );
      iBest = i;
    }
  }
  sqlite3_result_value(context, argv[iBest]);
}